

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::type_caster<unsigned_long,_void>::load
          (type_caster<unsigned_long,_void> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  long lVar4;
  handle src_or_index;
  object tmp;
  handle local_28;
  
  if ((((src.m_ptr != (PyObject *)0x0) && ((src.m_ptr)->ob_type != (PyTypeObject *)&PyFloat_Type))
      && (iVar2 = PyType_IsSubtype((src.m_ptr)->ob_type,&PyFloat_Type), iVar2 == 0)) &&
     (((convert || (((src.m_ptr)->ob_type->tp_flags & 0x1000000) != 0)) ||
      (iVar2 = PyIndex_Check(src.m_ptr), iVar2 != 0)))) {
    uVar3 = as_unsigned<unsigned_long>(src.m_ptr);
    if ((uVar3 != 0xffffffffffffffff) || (lVar4 = PyErr_Occurred(), lVar4 == 0)) {
      this->value = uVar3;
      return true;
    }
    PyErr_Clear();
    if ((convert) && (iVar2 = PyNumber_Check(src.m_ptr), iVar2 != 0)) {
      local_28.m_ptr = (PyObject *)PyNumber_Long(src.m_ptr);
      PyErr_Clear();
      bVar1 = load(this,local_28,false);
      handle::dec_ref(&local_28);
      return bVar1;
    }
  }
  return false;
}

Assistant:

static handle cast(const void *ptr, return_value_policy /* policy */, handle /* parent */) {
        if (ptr) {
            return capsule(ptr).release();
        }
        return none().release();
    }